

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_split.hpp
# Opt level: O3

array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
* detail::operator|(array<std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>,_2UL>
                    *__return_storage_ptr__,b_str<char32_t> *str,
                   split_helper_subroutine<detail::split_at_first,_char32_t,_char32_t> *info)

{
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar1;
  anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
  *paVar2;
  char32_t cVar3;
  pointer pcVar4;
  ulong uVar5;
  undefined8 uVar6;
  long lVar7;
  size_type __pos;
  ulong uVar8;
  size_t __i;
  ulong uVar9;
  basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_> local_40;
  
  pcVar4 = (str->_M_dataplus)._M_p;
  uVar5 = str->_M_string_length;
  if (uVar5 == 0) {
LAB_001b4f44:
    paVar1 = &__return_storage_ptr__->_M_elems[0].field_2;
    __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p = (pointer)paVar1;
    paVar2 = &str->field_2;
    if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
         *)pcVar4 == paVar2) {
      uVar6 = *(undefined8 *)((long)&str->field_2 + 8);
      paVar1->_M_allocated_capacity = paVar2->_M_allocated_capacity;
      *(undefined8 *)((long)&__return_storage_ptr__->_M_elems[0].field_2 + 8) = uVar6;
    }
    else {
      __return_storage_ptr__->_M_elems[0]._M_dataplus._M_p = pcVar4;
      __return_storage_ptr__->_M_elems[0].field_2._M_allocated_capacity =
           paVar2->_M_allocated_capacity;
    }
    __return_storage_ptr__->_M_elems[0]._M_string_length = uVar5;
    (str->_M_dataplus)._M_p = (pointer)paVar2;
    str->_M_string_length = 0;
    (str->field_2)._M_local_buf[0] = L'\0';
    __return_storage_ptr__->_M_elems[1]._M_dataplus._M_p =
         (pointer)&__return_storage_ptr__->_M_elems[1].field_2;
    __return_storage_ptr__->_M_elems[1]._M_string_length = 0;
    __return_storage_ptr__->_M_elems[1].field_2._M_local_buf[0] = L'\0';
    return __return_storage_ptr__;
  }
  cVar3 = info->delim;
  uVar9 = 0;
  while (pcVar4[uVar9] != cVar3) {
    uVar9 = uVar9 + 1;
    if (uVar5 == uVar9) goto LAB_001b4f44;
  }
  if (uVar9 == 0xffffffffffffffff) goto LAB_001b4f44;
  lVar7 = 0x10;
  do {
    *(long *)((long)__return_storage_ptr__->_M_elems + lVar7 + -0x10) =
         (long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar7;
    *(undefined8 *)((long)__return_storage_ptr__->_M_elems + lVar7 + -8) = 0;
    *(undefined4 *)((long)&__return_storage_ptr__->_M_elems[0]._M_dataplus._M_p + lVar7) = 0;
    lVar7 = lVar7 + 0x20;
  } while (lVar7 != 0x50);
  __pos = 0xffffffffffffffff;
  uVar8 = uVar9;
  if (uVar9 < uVar5) {
    do {
      __pos = uVar8;
      if (pcVar4[uVar8] != cVar3) break;
      uVar8 = uVar8 + 1;
      __pos = 0xffffffffffffffff;
    } while (uVar5 != uVar8);
  }
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  substr(&local_40,str,__pos,0xffffffffffffffff);
  std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
  operator=(__return_storage_ptr__->_M_elems + 1,&local_40);
  if ((anon_union_16_2_edb7204a_for_basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity * 4 + 4);
  }
  if (uVar9 <= str->_M_string_length) {
    str->_M_string_length = uVar9;
    (str->_M_dataplus)._M_p[uVar9] = L'\0';
    std::__cxx11::basic_string<char32_t,_std::char_traits<char32_t>,_std::allocator<char32_t>_>::
    operator=(__return_storage_ptr__->_M_elems,str);
    return __return_storage_ptr__;
  }
  std::__throw_out_of_range_fmt
            ("%s: __pos (which is %zu) > this->size() (which is %zu)","basic_string::erase",uVar9);
}

Assistant:

std::array<b_str<CharType>, 2> operator| (b_str<CharType>&& str, const split_helper_subroutine<split_at_first, DelimType, CharType>& info)
	{
		const std::size_t pos = str.find_first_of(info.delim);
		if (b_str<CharType>::npos == pos) return{ { std::move(str),{} } };
		std::array<b_str<CharType>, 2> re;
		re[1] = str.substr(str.find_first_not_of(info.delim, pos));
		str.erase(pos);
		re[0] = std::move(str);
		return re;
	}